

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentEditor.cpp
# Opt level: O3

void __thiscall
InstrumentEditor::InstrumentEditor
          (InstrumentEditor *this,Module *mod,InstrumentListModel *model,
          WaveListModel *waveListModel,PianoInput *input,QWidget *parent)

{
  QComboBox **ppQVar1;
  Data *pDVar2;
  int *piVar3;
  uint uVar4;
  QString *data;
  QGroupBox *this_00;
  QVBoxLayout *pQVar5;
  QComboBox *pQVar6;
  QCheckBox *pQVar7;
  QGroupBox *pQVar8;
  EnvelopeForm *pEVar9;
  QHBoxLayout *pQVar10;
  QPushButton *pQVar11;
  QTabWidget *this_01;
  QWidget *pQVar12;
  SequenceEditor *pSVar13;
  undefined4 *puVar14;
  ulong uVar15;
  long lVar16;
  size_t sequenceIndex;
  QString local_d8;
  long local_c0 [2];
  qsizetype qStack_b0;
  char local_a8 [24];
  char local_90 [24];
  QArrayDataPointer<QString> local_78;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QArrayData *d;
  
  BaseEditor::BaseEditor(&this->super_BaseEditor,&model->super_BaseTableModel,input,parent);
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog = &PTR_metaObject_001fc430;
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog.field_0x10 =
       &PTR__InstrumentEditor_001fc610;
  this->mModule = mod;
  this->mWaveListModel = waveListModel;
  this->mChannelCombo = (QComboBox *)0x0;
  this->mSetEnvelopeCheck = (QCheckBox *)0x0;
  this->mEnvelopeGroup = (QGroupBox *)0x0;
  this->mEnvelopeForm = (EnvelopeForm *)0x0;
  this->mWaveformGroup = (QGroupBox *)0x0;
  this->mWaveformCombo = (QComboBox *)0x0;
  this->mWaveformEditButton = (QPushButton *)0x0;
  this->mSequenceTabs = (QTabWidget *)0x0;
  (this->mSequenceEditors)._M_elems[0] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[1] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[2] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[3] = (SequenceEditor *)0x0;
  (this->mInstrument).super___shared_ptr<trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mInstrument).super___shared_ptr<trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mCanEdit = true;
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b4338);
  QWidget::setWindowTitle((QString *)this);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  this_00 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b434a);
  QGroupBox::QGroupBox(this_00,&local_d8,(QWidget *)0x0);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  pQVar6 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar6,(QWidget *)0x0);
  ppQVar1 = &this->mChannelCombo;
  *ppQVar1 = pQVar6;
  pQVar7 = (QCheckBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b43af);
  QCheckBox::QCheckBox(pQVar7,&local_d8,(QWidget *)0x0);
  this->mSetEnvelopeCheck = pQVar7;
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QBoxLayout::addWidget(pQVar5,*ppQVar1,0);
  QBoxLayout::addWidget(pQVar5,this->mSetEnvelopeCheck,0);
  QBoxLayout::addStretch((int)pQVar5);
  QWidget::setLayout((QLayout *)this_00);
  pQVar8 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b4352);
  QGroupBox::QGroupBox(pQVar8,&local_d8,(QWidget *)0x0);
  this->mEnvelopeGroup = pQVar8;
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  pEVar9 = (EnvelopeForm *)operator_new(0x140);
  EnvelopeForm::EnvelopeForm(pEVar9,(QWidget *)0x0);
  this->mEnvelopeForm = pEVar9;
  QBoxLayout::addWidget(pQVar5,pEVar9,0);
  QBoxLayout::addStretch((int)pQVar5);
  QLayout::setContentsMargins((int)pQVar5,0,0,0);
  QWidget::setLayout((QLayout *)this->mEnvelopeGroup);
  pQVar8 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b4362);
  QGroupBox::QGroupBox(pQVar8,&local_d8,(QWidget *)0x0);
  this->mWaveformGroup = pQVar8;
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar10 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar10);
  pQVar6 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar6,(QWidget *)0x0);
  this->mWaveformCombo = pQVar6;
  (**(code **)(*(long *)pQVar6 + 0x1a0))(pQVar6,this->mWaveListModel);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b45f9);
  QPushButton::QPushButton(pQVar11,&local_d8,(QWidget *)0x0);
  this->mWaveformEditButton = pQVar11;
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QPushButton::setAutoDefault(SUB81(this->mWaveformEditButton,0));
  QPushButton::setDefault(SUB81(this->mWaveformEditButton,0));
  QBoxLayout::addWidget(pQVar10,this->mWaveformCombo,1);
  QBoxLayout::addWidget(pQVar10,this->mWaveformEditButton,0);
  QLayoutItem::setAlignment(pQVar10 + 0x10,0x20);
  QWidget::setLayout((QLayout *)this->mWaveformGroup);
  this_01 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(this_01,(QWidget *)0x0);
  this->mSequenceTabs = this_01;
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  pQVar10 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar10);
  QBoxLayout::addWidget(pQVar10,this_00,0);
  QBoxLayout::addWidget(pQVar10,this->mEnvelopeGroup,1);
  QBoxLayout::addWidget(pQVar10,this->mWaveformGroup,1);
  QBoxLayout::addLayout((QLayout *)pQVar5,(int)pQVar10);
  QBoxLayout::addWidget(pQVar5,this->mSequenceTabs,1);
  QLayout::setContentsMargins((int)pQVar5,0,0,0);
  pQVar12 = BaseEditor::editorWidget(&this->super_BaseEditor);
  QWidget::setLayout((QLayout *)pQVar12);
  QWidget::hide();
  QWidget::setEnabled(SUB81(this->mWaveformGroup,0));
  QWidget::setEnabled(SUB81(this->mEnvelopeGroup,0));
  pQVar6 = *ppQVar1;
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b436b);
  QMetaObject::tr((char *)local_c0,(char *)&staticMetaObject,0x1b4376);
  QMetaObject::tr(local_a8,(char *)&staticMetaObject,0x1b4381);
  QMetaObject::tr(local_90,(char *)&staticMetaObject,0x1b438c);
  local_78.ptr = (QString *)QArrayData::allocate(&d,0x18,8,4,KeepSize);
  local_78.d = (Data *)d;
  local_78.size = 0;
  uVar15 = 0xffffffffffffffe8;
  do {
    pDVar2 = *(Data **)((long)local_c0 + uVar15);
    local_78.ptr[local_78.size].d.d = pDVar2;
    local_78.ptr[local_78.size].d.ptr = *(char16_t **)((long)local_c0 + uVar15 + 8);
    local_78.ptr[local_78.size].d.size = *(qsizetype *)(local_a8 + (uVar15 - 8));
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_78.size = local_78.size + 1;
    uVar15 = uVar15 + 0x18;
  } while (uVar15 < 0x48);
  uVar4 = QComboBox::count();
  QComboBox::insertItems((int)pQVar6,(QList *)(ulong)uVar4);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  lVar16 = 0x48;
  do {
    piVar3 = *(int **)((long)&local_d8.d.d + lVar16);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&local_d8.d.d + lVar16),2,8);
      }
    }
    lVar16 = lVar16 + -0x18;
  } while (lVar16 != -0x18);
  sequenceIndex = 0;
  do {
    pSVar13 = (SequenceEditor *)operator_new(0x50);
    SequenceEditor::SequenceEditor(pSVar13,mod,sequenceIndex,(QWidget *)0x0);
    (this->mSequenceEditors)._M_elems[sequenceIndex] = pSVar13;
    sequenceIndex = sequenceIndex + 1;
  } while (sequenceIndex != 4);
  pQVar12 = (QWidget *)this->mSequenceTabs;
  pSVar13 = (this->mSequenceEditors)._M_elems[0];
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b4398);
  QTabWidget::addTab(pQVar12,(QString *)pSVar13);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar12 = (QWidget *)this->mSequenceTabs;
  pSVar13 = (this->mSequenceEditors)._M_elems[1];
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b43a1);
  QTabWidget::addTab(pQVar12,(QString *)pSVar13);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar12 = (QWidget *)this->mSequenceTabs;
  pSVar13 = (this->mSequenceEditors)._M_elems[2];
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b43a9);
  QTabWidget::addTab(pQVar12,(QString *)pSVar13);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar12 = (QWidget *)this->mSequenceTabs;
  pSVar13 = (this->mSequenceEditors)._M_elems[3];
  QMetaObject::tr((char *)&local_d8,(char *)&staticMetaObject,0x1b43c5);
  QTabWidget::addTab(pQVar12,(QString *)pSVar13);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar7 = this->mSetEnvelopeCheck;
  local_d8.d.d = (Data *)QAbstractButton::toggled;
  local_d8.d.ptr = (char16_t *)0x0;
  puVar14 = (undefined4 *)operator_new(0x18);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:114:9),_1,_QtPrivate::List<bool>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar14 + 4) = this;
  QObject::connectImpl
            (local_40,(void **)pQVar7,(QObject *)&local_d8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar6 = *ppQVar1;
  local_d8.d.d = (Data *)QComboBox::currentIndexChanged;
  local_d8.d.ptr = (char16_t *)0x0;
  puVar14 = (undefined4 *)operator_new(0x18);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:121:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar14 + 4) = this;
  QObject::connectImpl
            (local_48,(void **)pQVar6,(QObject *)&local_d8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar6 = this->mWaveformCombo;
  local_d8.d.d = (Data *)QComboBox::currentIndexChanged;
  local_d8.d.ptr = (char16_t *)0x0;
  local_78.d = (Data *)setEnvelopeToWaveform;
  local_78.ptr = (QString *)0x0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::QSlotObject<void_(InstrumentEditor::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar14 + 4) = setEnvelopeToWaveform;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar6,(QObject *)&local_d8,(void **)this,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar11 = this->mWaveformEditButton;
  local_d8.d.d = (Data *)QAbstractButton::clicked;
  local_d8.d.ptr = (char16_t *)0x0;
  puVar14 = (undefined4 *)operator_new(0x18);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:158:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar14 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)pQVar11,(QObject *)&local_d8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pEVar9 = this->mEnvelopeForm;
  local_d8.d.d = (Data *)EnvelopeForm::envelopeChanged;
  local_d8.d.ptr = (char16_t *)0x0;
  local_78.d = (Data *)setEnvelope;
  local_78.ptr = (QString *)0x0;
  puVar14 = (undefined4 *)operator_new(0x20);
  *puVar14 = 1;
  *(code **)(puVar14 + 2) =
       QtPrivate::
       QSlotObject<void_(InstrumentEditor::*)(unsigned_char),_QtPrivate::List<unsigned_char>,_void>
       ::impl;
  *(code **)(puVar14 + 4) = setEnvelope;
  *(undefined8 *)(puVar14 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pEVar9,(QObject *)&local_d8,(void **)this,
             (QSlotObjectBase *)&local_78,(ConnectionType)puVar14,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  return;
}

Assistant:

InstrumentEditor::InstrumentEditor(
    Module &mod,
    InstrumentListModel &model,
    WaveListModel &waveListModel,
    PianoInput const& input,
    QWidget *parent
) :
    BaseEditor(model, input, parent),
    mModule(mod),
    mWaveListModel(waveListModel),
    mChannelCombo(nullptr),
    mSetEnvelopeCheck(nullptr),
    mEnvelopeGroup(nullptr),
    mEnvelopeForm(nullptr),
    mWaveformGroup(nullptr),
    mWaveformCombo(nullptr),
    mWaveformEditButton(nullptr),
    mSequenceTabs(nullptr),
    mSequenceEditors(),
    mInstrument(nullptr),
    mCanEdit(true)
{
    setWindowTitle(tr("Instrument editor"));
    auto channelGroup = new QGroupBox(tr("Channel"));
    {
        auto layout = new QVBoxLayout;
        mChannelCombo = new QComboBox;
        mSetEnvelopeCheck = new QCheckBox(tr(TU::SET_VOLUME_CHECK_STR));
        layout->addWidget(mChannelCombo);
        layout->addWidget(mSetEnvelopeCheck);
        layout->addStretch();
        channelGroup->setLayout(layout);
    }

    mEnvelopeGroup = new QGroupBox(tr("Volume envelope"));
    {
        auto layout = new QVBoxLayout;
        mEnvelopeForm = new EnvelopeForm;
        layout->addWidget(mEnvelopeForm);
        layout->addStretch();
        layout->setContentsMargins(0, 0, 0, 0);
        mEnvelopeGroup->setLayout(layout);
    }

    mWaveformGroup = new QGroupBox(tr("Waveform"));
    {
        auto layout = new QHBoxLayout;
        mWaveformCombo = new QComboBox;
        mWaveformCombo->setModel(&mWaveListModel);
        mWaveformEditButton = new QPushButton(tr("Edit"));
        mWaveformEditButton->setAutoDefault(false);
        mWaveformEditButton->setDefault(false);
        layout->addWidget(mWaveformCombo, 1);
        layout->addWidget(mWaveformEditButton);
        layout->setAlignment(Qt::AlignTop);
        mWaveformGroup->setLayout(layout);

        
    }

    mSequenceTabs = new QTabWidget;

    auto layout = new QVBoxLayout;
    auto settingsLayout = new QHBoxLayout;
    settingsLayout->addWidget(channelGroup);
    settingsLayout->addWidget(mEnvelopeGroup, 1);
    settingsLayout->addWidget(mWaveformGroup, 1);
    layout->addLayout(settingsLayout);
    layout->addWidget(mSequenceTabs, 1);
    layout->setContentsMargins(0, 0, 0, 0);
    editorWidget()->setLayout(layout);
    
    mWaveformGroup->hide();
    mWaveformGroup->setEnabled(false);
    mEnvelopeGroup->setEnabled(false);
    
    mChannelCombo->addItems({
        tr("CH1 - Duty"),
        tr("CH2 - Duty"),
        tr("CH3 - Wave"),
        tr("CH4 - Noise")
    });

    for (size_t i = 0; i < trackerboy::Instrument::SEQUENCE_COUNT; ++i) {
        mSequenceEditors[i] = new SequenceEditor(mod, i);
    }
    

    mSequenceTabs->addTab(mSequenceEditors[0], tr("Arpeggio"));
    mSequenceTabs->addTab(mSequenceEditors[1], tr("Panning"));
    mSequenceTabs->addTab(mSequenceEditors[2], tr("Pitch"));
    mSequenceTabs->addTab(mSequenceEditors[3], tr(TU::DUTY_CYCLE_STR));
    

    connect(mSetEnvelopeCheck, &QCheckBox::toggled, this,
        [this](bool checked) {
            mEnvelopeGroup->setEnabled(checked);
            mWaveformGroup->setEnabled(checked);
            setEnvelopeEnable(checked);
        });

    connect(mChannelCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index == -1) {
                return;
            }
            setChannel(index);
            
            auto const isWave = index == 2;
            mWaveformGroup->setVisible(isWave);
            mEnvelopeGroup->setVisible(!isWave);

            switch (index) {
                case 0:
                case 1:
                    mSequenceTabs->setTabText(3, tr(TU::DUTY_CYCLE_STR));
                    break;
                case 2:
                    mSequenceTabs->setTabText(3, tr("Volume"));
                    break;
                case 3:
                    mSequenceTabs->setTabText(3, tr("Noise"));
                    break;
            }

            if (isWave) {
                setEnvelopeToWaveform(mWaveformCombo->currentIndex());
                mSetEnvelopeCheck->setText(tr(TU::SET_WAVE_CHECK_STR));
            } else {
                setEnvelope(mEnvelopeForm->envelope());
                mSetEnvelopeCheck->setText(tr(TU::SET_VOLUME_CHECK_STR));
            }

        });

    
    connect(mWaveformCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &InstrumentEditor::setEnvelopeToWaveform);

    connect(mWaveformEditButton, &QPushButton::clicked, this,
        [this]() {
            emit openWaveEditor(mWaveformCombo->currentIndex());
        });

    connect(mEnvelopeForm, &EnvelopeForm::envelopeChanged, this, &InstrumentEditor::setEnvelope);

}